

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImFontAtlas::GlyphRangesBuilder::SetBit(GlyphRangesBuilder *this,int n)

{
  byte *pbVar1;
  
  if (n >> 3 < *(int *)this) {
    pbVar1 = (byte *)(*(long *)(this + 8) + (long)(n >> 3));
    *pbVar1 = *pbVar1 | (byte)(1 << ((byte)n & 7));
    return;
  }
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                ,0x38b,"value_type &ImVector<unsigned char>::operator[](int) [T = unsigned char]");
}

Assistant:

void           SetBit(int n)        { UsedChars[n >> 3] |= 1 << (n & 7); }